

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineTestRunner_defaultTestsAreRunInOrderTheyAreInRepository_TestShell::
~TEST_CommandLineTestRunner_defaultTestsAreRunInOrderTheyAreInRepository_TestShell
          (TEST_CommandLineTestRunner_defaultTestsAreRunInOrderTheyAreInRepository_TestShell *this)

{
  TEST_CommandLineTestRunner_defaultTestsAreRunInOrderTheyAreInRepository_TestShell *this_local;
  
  ~TEST_CommandLineTestRunner_defaultTestsAreRunInOrderTheyAreInRepository_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CommandLineTestRunner, defaultTestsAreRunInOrderTheyAreInRepository)
{
    const char* argv[] = { "tests.exe", "-v"};

    registry.addTest(test2);
    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    SimpleStringCollection stringCollection;
    commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().split("\n", stringCollection);
    STRCMP_CONTAINS("test2", stringCollection[0].asCharString());
    STRCMP_CONTAINS("test1", stringCollection[1].asCharString());
}